

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btSoftBodyTriangleCallback::setTimeStepAndCounters
          (btSoftBodyTriangleCallback *this,btScalar collisionMarginTriangle,
          btCollisionObjectWrapper *triBodyWrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  btVector3 aabbWorldSpaceMax;
  btVector3 aabbWorldSpaceMin;
  float local_88;
  float local_84;
  float local_80;
  float local_78;
  float local_74;
  float local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float local_58;
  float local_54;
  float local_50;
  float local_48;
  float local_44;
  float local_40;
  undefined8 local_38;
  float local_30;
  
  this->m_dispatchInfoPtr = dispatchInfo;
  this->m_collisionMarginTriangle = collisionMarginTriangle + 0.06;
  this->m_resultOut = resultOut;
  (*(this->m_softBody->super_btCollisionObject)._vptr_btCollisionObject[7])
            (this->m_softBody,&local_78,&local_88);
  fVar9 = (local_88 + local_78) * 0.5;
  fVar5 = (local_84 + local_74) * 0.5;
  fVar8 = (local_80 + local_70) * 0.5;
  btTransform::inverse(triBodyWrap->m_worldTransform);
  fVar6 = (float)local_38 + fVar8 * fStack_60 + fVar9 * local_68 + fVar5 * fStack_64;
  fVar7 = (float)((ulong)local_38 >> 0x20) + fVar8 * local_50 + fVar9 * local_58 + fVar5 * local_54;
  fVar10 = this->m_collisionMarginTriangle;
  fVar11 = (local_88 - local_78) * 0.5 + fVar10;
  fVar12 = (local_84 - local_74) * 0.5 + fVar10;
  fVar10 = (local_80 - local_70) * 0.5 + fVar10;
  fVar3 = fVar10 * ABS(local_68 * 0.0 + fStack_64 * 0.0 + fStack_60) +
          fVar11 * ABS(local_68 + fStack_64 * 0.0 + fStack_60 * 0.0) +
          fVar12 * ABS(local_68 * 0.0 + fStack_64 + fStack_60 * 0.0);
  fVar4 = fVar10 * ABS(local_58 * 0.0 + local_54 * 0.0 + local_50) +
          fVar11 * ABS(local_58 + local_54 * 0.0 + local_50 * 0.0) +
          fVar12 * ABS(local_58 * 0.0 + local_54 + local_50 * 0.0);
  local_30 = local_40 * fVar8 + local_48 * fVar9 + local_44 * fVar5 + local_30;
  fVar10 = fVar10 * ABS(local_48 * 0.0 + local_44 * 0.0 + local_40) +
           fVar11 * ABS(local_48 + local_44 * 0.0 + local_40 * 0.0) +
           ABS(local_48 * 0.0 + local_44 + local_40 * 0.0) * fVar12;
  auVar1._4_4_ = fVar7 - fVar4;
  auVar1._0_4_ = fVar6 - fVar3;
  auVar1._8_4_ = local_30 - fVar10;
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_aabbMin).m_floats = auVar1;
  auVar2._4_4_ = fVar4 + fVar7;
  auVar2._0_4_ = fVar3 + fVar6;
  auVar2._8_4_ = fVar10 + local_30;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_aabbMax).m_floats = auVar2;
  return;
}

Assistant:

void	btSoftBodyTriangleCallback::setTimeStepAndCounters(btScalar collisionMarginTriangle,const btCollisionObjectWrapper* triBodyWrap, const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	m_dispatchInfoPtr = &dispatchInfo;
	m_collisionMarginTriangle = collisionMarginTriangle+btScalar(BT_SOFTBODY_TRIANGLE_EXTRUSION);
	m_resultOut = resultOut;


	btVector3	aabbWorldSpaceMin,aabbWorldSpaceMax;
	m_softBody->getAabb(aabbWorldSpaceMin,aabbWorldSpaceMax);
	btVector3 halfExtents = (aabbWorldSpaceMax-aabbWorldSpaceMin)*btScalar(0.5);
	btVector3 softBodyCenter = (aabbWorldSpaceMax+aabbWorldSpaceMin)*btScalar(0.5);

	btTransform softTransform;
	softTransform.setIdentity();
	softTransform.setOrigin(softBodyCenter);

	btTransform convexInTriangleSpace;
	convexInTriangleSpace = triBodyWrap->getWorldTransform().inverse() * softTransform;
	btTransformAabb(halfExtents,m_collisionMarginTriangle,convexInTriangleSpace,m_aabbMin,m_aabbMax);
}